

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blns.cpp
# Opt level: O0

void blns::Blns::readFile(void)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  ulong uVar4;
  long lVar5;
  undefined1 local_380 [8];
  string line;
  path local_338;
  path local_310;
  path local_2d8;
  path local_2b0;
  path local_288;
  path local_260;
  path local_238;
  ifstream local_210 [8];
  ifstream blnsFile;
  
  std::filesystem::__cxx11::path::path<char[88],std::filesystem::__cxx11::path>
            (&local_2d8,
             (char (*) [88])
             "/workspace/llm4binary/github/license_c_cmakelists/eliabieri[P]blnscpp/src/blns/blns.cpp"
             ,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::path<char[3],std::filesystem::__cxx11::path>
            (&local_310,(char (*) [3])"..",auto_format);
  std::filesystem::__cxx11::operator/(&local_288,&local_2b0,&local_310);
  std::filesystem::__cxx11::path::path<char[3],std::filesystem::__cxx11::path>
            (&local_338,(char (*) [3])"..",auto_format);
  std::filesystem::__cxx11::operator/(&local_260,&local_288,&local_338);
  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
            ((path *)((long)&line.field_2 + 8),(char (*) [9])"blns.txt",auto_format);
  std::filesystem::__cxx11::operator/(&local_238,&local_260,(path *)((long)&line.field_2 + 8));
  std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            (local_210,&local_238,_S_in);
  std::filesystem::__cxx11::path::~path(&local_238);
  std::filesystem::__cxx11::path::~path((path *)((long)&line.field_2 + 8));
  std::filesystem::__cxx11::path::~path(&local_260);
  std::filesystem::__cxx11::path::~path(&local_338);
  std::filesystem::__cxx11::path::~path(&local_288);
  std::filesystem::__cxx11::path::~path(&local_310);
  std::filesystem::__cxx11::path::~path(&local_2b0);
  std::filesystem::__cxx11::path::~path(&local_2d8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    __assert_fail("blnsFile.is_open()",
                  "/workspace/llm4binary/github/license_c_cmakelists/eliabieri[P]blnscpp/src/blns/blns.cpp"
                  ,0x15,"static void blns::Blns::readFile()");
  }
  std::__cxx11::string::string((string *)local_380);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_210,(string *)local_380);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar2) break;
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) &&
       (lVar5 = std::__cxx11::string::rfind((char)local_380,0x23), lVar5 != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&s_blns_abi_cxx11_,(value_type *)local_380);
    }
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&s_blns_abi_cxx11_);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::__cxx11::string::~string((string *)local_380);
    std::ifstream::~ifstream(local_210);
    return;
  }
  __assert_fail("!s_blns.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/eliabieri[P]blnscpp/src/blns/blns.cpp"
                ,0x1e,"static void blns::Blns::readFile()");
}

Assistant:

void blns::Blns::readFile() {
    std::ifstream blnsFile = std::filesystem::path(__FILE__).parent_path()
                             / ".." / ".." / "blns.txt";

    // If this assertion fails, ensure that you have correctly
    // downloaded blns.txt at the root of the project during cmake build
    assert(blnsFile.is_open());

    std::string line;
    while(getline(blnsFile, line)) {
        // Skip comments in txt file
        if(!line.empty() && line.rfind('#', 0) != 0) {
            s_blns.push_back(line);
        }
    }
    assert(!s_blns.empty());
}